

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_scheduler.cpp
# Opt level: O0

void __thiscall async::threadpool_scheduler::schedule(threadpool_scheduler *this,task_run_handle *t)

{
  __int_type _Var1;
  undefined1 auVar2 [8];
  pointer ptVar3;
  thread_data_t *this_00;
  type pptVar4;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  size_t num_waiters_val_1;
  lock_guard<std::mutex> local_e8;
  lock_guard<std::mutex> locked_1;
  size_t num_waiters_val;
  lock_guard<std::mutex> locked;
  task_run_handle local_b8;
  undefined1 local_b0 [8];
  threadpool_data_wrapper wrapper;
  task_run_handle *t_local;
  threadpool_scheduler *this_local;
  memory_order __b_3;
  memory_order __b_1;
  memory_order __b;
  memory_order __b_4;
  memory_order __b_2;
  
  wrapper.thread_id = (size_t)t;
  _local_b0 = detail::get_threadpool_data_wrapper();
  auVar2 = local_b0;
  ptVar3 = std::
           unique_ptr<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
           ::get(&this->impl);
  if (auVar2 == (undefined1  [8])ptVar3) {
    ptVar3 = std::
             unique_ptr<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
             ::operator->(&this->impl);
    this_00 = detail::aligned_array<async::detail::thread_data_t,_64UL>::operator[]
                        (&ptVar3->thread_data,(size_t)wrapper.owning_threadpool);
    task_run_handle::task_run_handle(&local_b8,t);
    detail::work_steal_queue::push(&this_00->queue,&local_b8);
    task_run_handle::~task_run_handle(&local_b8);
    ptVar3 = std::
             unique_ptr<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
             ::operator->(&this->impl);
    std::operator&(memory_order_relaxed,__memory_order_mask);
    if ((ptVar3->num_waiters).super___atomic_base<unsigned_long>._M_i != 0) {
      ptVar3 = std::
               unique_ptr<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
               ::operator->(&this->impl);
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)&num_waiters_val,&ptVar3->lock);
      ptVar3 = std::
               unique_ptr<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
               ::operator->(&this->impl);
      std::operator&(memory_order_relaxed,__memory_order_mask);
      _Var1 = (ptVar3->num_waiters).super___atomic_base<unsigned_long>._M_i;
      if (_Var1 != 0) {
        ptVar3 = std::
                 unique_ptr<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
                 ::operator->(&this->impl);
        pptVar4 = std::
                  unique_ptr<async::detail::task_wait_event_*[],_std::default_delete<async::detail::task_wait_event_*[]>_>
                  ::operator[](&ptVar3->waiters,_Var1 - 1);
        detail::task_wait_event::signal(*pptVar4,2,__handler);
        ptVar3 = std::
                 unique_ptr<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
                 ::operator->(&this->impl);
        std::operator&(memory_order_relaxed,__memory_order_mask);
        (ptVar3->num_waiters).super___atomic_base<unsigned_long>._M_i = _Var1 - 1;
      }
      locked_1._M_device._5_3_ = 0;
      locked_1._M_device._4_1_ = _Var1 == 0;
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&num_waiters_val);
    }
  }
  else {
    ptVar3 = std::
             unique_ptr<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
             ::operator->(&this->impl);
    std::lock_guard<std::mutex>::lock_guard(&local_e8,&ptVar3->lock);
    ptVar3 = std::
             unique_ptr<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
             ::operator->(&this->impl);
    task_run_handle::task_run_handle((task_run_handle *)&num_waiters_val_1,t);
    detail::fifo_queue::push(&ptVar3->public_queue,(task_run_handle *)&num_waiters_val_1);
    task_run_handle::~task_run_handle((task_run_handle *)&num_waiters_val_1);
    ptVar3 = std::
             unique_ptr<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
             ::operator->(&this->impl);
    std::operator&(memory_order_relaxed,__memory_order_mask);
    _Var1 = (ptVar3->num_waiters).super___atomic_base<unsigned_long>._M_i;
    if (_Var1 != 0) {
      ptVar3 = std::
               unique_ptr<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
               ::operator->(&this->impl);
      pptVar4 = std::
                unique_ptr<async::detail::task_wait_event_*[],_std::default_delete<async::detail::task_wait_event_*[]>_>
                ::operator[](&ptVar3->waiters,_Var1 - 1);
      detail::task_wait_event::signal(*pptVar4,2,__handler_00);
      ptVar3 = std::
               unique_ptr<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
               ::operator->(&this->impl);
      std::operator&(memory_order_relaxed,__memory_order_mask);
      (ptVar3->num_waiters).super___atomic_base<unsigned_long>._M_i = _Var1 - 1;
    }
    locked_1._M_device._5_3_ = 0;
    locked_1._M_device._4_1_ = _Var1 == 0;
    std::lock_guard<std::mutex>::~lock_guard(&local_e8);
  }
  return;
}

Assistant:

void threadpool_scheduler::schedule(task_run_handle t)
{
	detail::threadpool_data_wrapper wrapper = detail::get_threadpool_data_wrapper();
	
	// Check if we are in the thread pool
	if (wrapper.owning_threadpool == impl.get()) {
		// Push the task onto our task queue
		impl->thread_data[wrapper.thread_id].queue.push(std::move(t));

		// If there are no sleeping threads, just return. We check outside the
		// lock to avoid locking overhead in the fast path.
		if (impl->num_waiters.load(std::memory_order_relaxed) == 0)
			return;

		// Get a thread to wake up from the list
		std::lock_guard<std::mutex> locked(impl->lock);

		// Check again if there are waiters
		size_t num_waiters_val = impl->num_waiters.load(std::memory_order_relaxed);
		if (num_waiters_val == 0)
			return;

		// Pop a thread from the list and wake it up
		impl->waiters[num_waiters_val - 1]->signal(detail::wait_type::task_available);
		impl->num_waiters.store(num_waiters_val - 1, std::memory_order_relaxed);
	} else {
		std::lock_guard<std::mutex> locked(impl->lock);

		// Push task onto the public queue
		impl->public_queue.push(std::move(t));

		// Wake up a sleeping thread
		size_t num_waiters_val = impl->num_waiters.load(std::memory_order_relaxed);
		if (num_waiters_val == 0)
			return;
		impl->waiters[num_waiters_val - 1]->signal(detail::wait_type::task_available);
		impl->num_waiters.store(num_waiters_val - 1, std::memory_order_relaxed);
	}
}